

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O1

QIcon __thiscall QFileIconProvider::icon(QFileIconProvider *this,QFileInfo *info)

{
  long lVar1;
  QIcon QVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QIcon retIcon;
  QArrayData *local_68;
  storage_type_conflict *local_60;
  long local_58;
  QArrayData *local_50 [2];
  long local_40;
  QIcon local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(info + 8);
  local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractFileIconProviderPrivate::getPlatformThemeIcon((QFileInfo *)&local_38);
  cVar3 = QIcon::isNull();
  QVar2.d = local_38.d;
  if (cVar3 == '\0') {
    local_38.d = (QIconPrivate *)0x0;
    *(QIconPrivate **)this = QVar2.d;
    goto LAB_002b8784;
  }
  QFileInfo::absoluteFilePath();
  if ((local_40 == 0) || (cVar3 = QFileSystemEntry::isRootPath((QString *)local_50), cVar3 != '\0'))
  {
LAB_002b8749:
    QFileIconProviderPrivate::getIcon((QFileIconProviderPrivate *)this,(StandardPixmap)lVar1);
  }
  else {
    cVar3 = QFileInfo::isFile();
    if (cVar3 != '\0') {
      QFileInfo::isSymLink();
      goto LAB_002b8749;
    }
    cVar3 = QFileInfo::isDir();
    if (cVar3 != '\0') {
      cVar3 = QFileInfo::isSymLink();
      if (cVar3 == '\0') {
        QFileInfo::absoluteFilePath();
        if (local_58 == *(long *)(lVar1 + 0x30)) {
          QVar4.m_data = local_60;
          QVar4.m_size = local_58;
          QVar5.m_data = *(storage_type_conflict **)(lVar1 + 0x28);
          QVar5.m_size = *(long *)(lVar1 + 0x30);
          QtPrivate::equalStrings(QVar4,QVar5);
        }
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,2,0x10);
          }
        }
      }
      goto LAB_002b8749;
    }
    QIcon::QIcon((QIcon *)this);
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
LAB_002b8784:
  QIcon::~QIcon(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFileIconProvider::icon(const QFileInfo &info) const
{
    Q_D(const QFileIconProvider);

    QIcon retIcon = d->getIcon(info);
    if (!retIcon.isNull())
        return retIcon;

    const QString &path = info.absoluteFilePath();
    if (path.isEmpty() || QFileSystemEntry::isRootPath(path))
#if defined (Q_OS_WIN)
    {
        UINT type = GetDriveType(reinterpret_cast<const wchar_t *>(path.utf16()));

        switch (type) {
        case DRIVE_REMOVABLE:
            return d->getIcon(QStyle::SP_DriveFDIcon);
        case DRIVE_FIXED:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        case DRIVE_REMOTE:
            return d->getIcon(QStyle::SP_DriveNetIcon);
        case DRIVE_CDROM:
            return d->getIcon(QStyle::SP_DriveCDIcon);
        case DRIVE_RAMDISK:
        case DRIVE_UNKNOWN:
        case DRIVE_NO_ROOT_DIR:
        default:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        }
    }
#else
    return d->getIcon(QStyle::SP_DriveHDIcon);
#endif

    if (info.isFile()) {
        if (info.isSymLink())
            return d->getIcon(QStyle::SP_FileLinkIcon);
        else
            return d->getIcon(QStyle::SP_FileIcon);
    }
  if (info.isDir()) {
    if (info.isSymLink()) {
      return d->getIcon(QStyle::SP_DirLinkIcon);
    } else {
      if (info.absoluteFilePath() == d->homePath) {
        return d->getIcon(QStyle::SP_DirHomeIcon);
      } else {
        return d->getIcon(QStyle::SP_DirIcon);
      }
    }
  }
  return QIcon();
}